

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O3

vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *
deqp::gles31::Functional::anon_unknown_0::varyingCompatVtxOutputs
          (vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
           *__return_storage_ptr__,VaryingInterface *varyings)

{
  vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *extraout_RAX;
  vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *pvVar1;
  pointer pVVar2;
  vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *pvVar3;
  long lVar4;
  
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::vector
            (__return_storage_ptr__,&varyings->vtxOutputs);
  pVVar2 = (__return_storage_ptr__->
           super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pvVar1 = extraout_RAX;
  if ((__return_storage_ptr__->
      super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>).
      _M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    lVar4 = 0x40;
    pvVar3 = (vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)0x0;
    do {
      *(undefined4 *)((long)pVVar2 + lVar4 + -0x2c) =
           *(undefined4 *)
            ((long)(varyings->frgInputs).
                   super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar4 + -0x2c);
      std::__cxx11::string::_M_assign((string *)((long)&(pVVar2->layout).location + lVar4));
      pvVar3 = (vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
               ((long)&(pvVar3->
                       super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
      pVVar2 = (__return_storage_ptr__->
               super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar1 = (vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
               (((long)(__return_storage_ptr__->
                       super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 5) *
               -0x5555555555555555);
      lVar4 = lVar4 + 0x60;
    } while (pvVar3 < pvVar1);
  }
  return pvVar1;
}

Assistant:

vector<VariableDeclaration> varyingCompatVtxOutputs (const VaryingInterface& varyings)
{
	vector<VariableDeclaration> outputs = varyings.vtxOutputs;

	for (size_t i = 0; i < outputs.size(); ++i)
	{
		outputs[i].interpolation = varyings.frgInputs[i].interpolation;
		outputs[i].name = varyings.frgInputs[i].name;
	}

	return outputs;
}